

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O0

XYZ __thiscall pbrt::SampledSpectrum::ToXYZ(SampledSpectrum *this,SampledWavelengths *lambda)

{
  undefined8 uVar1;
  SampledSpectrum b;
  SampledSpectrum b_00;
  SampledSpectrum a;
  SampledSpectrum a_00;
  SampledSpectrum a_01;
  SampledWavelengths *in_RDI;
  Float X_00;
  Float Y_00;
  Float Z_00;
  undefined1 in_ZMM0 [64];
  undefined1 auVar13 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 extraout_var [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar24 [56];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  XYZ XVar25;
  SampledSpectrum SVar26;
  SampledSpectrum pdf;
  SampledSpectrum Z;
  SampledSpectrum Y;
  SampledSpectrum X;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  undefined8 in_stack_fffffffffffffed0;
  XYZ *this_00;
  SampledWavelengths *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  float in_stack_fffffffffffffee4;
  XYZ local_6c;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined1 auVar2 [64];
  undefined1 auVar12 [64];
  undefined1 auVar14 [64];
  
  auVar24 = in_ZMM1._8_56_;
  auVar13 = in_ZMM0._8_56_;
  Spectra::X();
  SVar26 = DenselySampledSpectrum::Sample
                     ((DenselySampledSpectrum *)
                      CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                      in_stack_fffffffffffffed8);
  auVar14._0_8_ = SVar26.values.values._8_8_;
  auVar14._8_56_ = auVar24;
  auVar2._0_8_ = SVar26.values.values._0_8_;
  auVar2._8_56_ = auVar13;
  local_30 = vmovlpd_avx(auVar2._0_16_);
  local_28 = vmovlpd_avx(auVar14._0_16_);
  Spectra::Y();
  SVar26 = DenselySampledSpectrum::Sample
                     ((DenselySampledSpectrum *)
                      CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                      in_stack_fffffffffffffed8);
  auVar15._0_8_ = SVar26.values.values._8_8_;
  auVar15._8_56_ = auVar24;
  auVar3._0_8_ = SVar26.values.values._0_8_;
  auVar3._8_56_ = auVar13;
  local_40 = vmovlpd_avx(auVar3._0_16_);
  local_38 = vmovlpd_avx(auVar15._0_16_);
  Spectra::Z();
  SVar26 = DenselySampledSpectrum::Sample
                     ((DenselySampledSpectrum *)
                      CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                      in_stack_fffffffffffffed8);
  auVar16._0_8_ = SVar26.values.values._8_8_;
  auVar16._8_56_ = auVar24;
  auVar4._0_8_ = SVar26.values.values._0_8_;
  auVar4._8_56_ = auVar13;
  local_50 = vmovlpd_avx(auVar4._0_16_);
  local_48 = vmovlpd_avx(auVar16._0_16_);
  SVar26 = SampledWavelengths::PDF(in_RDI);
  auVar17._0_8_ = SVar26.values.values._8_8_;
  auVar17._8_56_ = auVar24;
  auVar5._0_8_ = SVar26.values.values._0_8_;
  auVar5._8_56_ = auVar13;
  local_60 = vmovlpd_avx(auVar5._0_16_);
  uStack_58 = vmovlpd_avx(auVar17._0_16_);
  SVar26 = operator*((SampledSpectrum *)
                     CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                     (SampledSpectrum *)in_RDI);
  auVar18._0_8_ = SVar26.values.values._8_8_;
  auVar18._8_56_ = auVar24;
  auVar6._0_8_ = SVar26.values.values._0_8_;
  auVar6._8_56_ = auVar13;
  vmovlpd_avx(auVar6._0_16_);
  vmovlpd_avx(auVar18._0_16_);
  auVar13 = ZEXT856(0);
  auVar24 = ZEXT856(0);
  a.values.values[2] = (float)in_stack_fffffffffffffee0;
  a.values.values._0_8_ = in_stack_fffffffffffffed8;
  a.values.values[3] = in_stack_fffffffffffffee4;
  SVar26.values.values[1] = (float)in_stack_fffffffffffffecc;
  SVar26.values.values[0] = (float)in_stack_fffffffffffffec8;
  SVar26.values.values[2] = (float)(int)in_stack_fffffffffffffed0;
  SVar26.values.values[3] = (float)(int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  SVar26 = SafeDiv(a,SVar26);
  auVar19._0_8_ = SVar26.values.values._8_8_;
  auVar19._8_56_ = auVar24;
  auVar7._0_8_ = SVar26.values.values._0_8_;
  auVar7._8_56_ = auVar13;
  vmovlpd_avx(auVar7._0_16_);
  vmovlpd_avx(auVar19._0_16_);
  X_00 = Average((SampledSpectrum *)in_RDI);
  auVar13 = extraout_var;
  SVar26 = operator*((SampledSpectrum *)CONCAT44(X_00,in_stack_fffffffffffffec8),
                     (SampledSpectrum *)in_RDI);
  auVar20._0_8_ = SVar26.values.values._8_8_;
  auVar20._8_56_ = auVar24;
  auVar8._0_8_ = SVar26.values.values._0_8_;
  auVar8._8_56_ = auVar13;
  vmovlpd_avx(auVar8._0_16_);
  vmovlpd_avx(auVar20._0_16_);
  auVar13 = ZEXT856(0);
  auVar24 = ZEXT856(0);
  a_00.values.values[2] = (float)in_stack_fffffffffffffee0;
  a_00.values.values._0_8_ = in_stack_fffffffffffffed8;
  a_00.values.values[3] = in_stack_fffffffffffffee4;
  b.values.values[1] = X_00;
  b.values.values[0] = (float)in_stack_fffffffffffffec8;
  b.values.values[2] = (float)(int)in_stack_fffffffffffffed0;
  b.values.values[3] = (float)(int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  SVar26 = SafeDiv(a_00,b);
  auVar21._0_8_ = SVar26.values.values._8_8_;
  auVar21._8_56_ = auVar24;
  auVar9._0_8_ = SVar26.values.values._0_8_;
  auVar9._8_56_ = auVar13;
  vmovlpd_avx(auVar9._0_16_);
  vmovlpd_avx(auVar21._0_16_);
  Y_00 = Average((SampledSpectrum *)in_RDI);
  auVar13 = extraout_var_00;
  SVar26 = operator*((SampledSpectrum *)CONCAT44(X_00,Y_00),(SampledSpectrum *)in_RDI);
  auVar22._0_8_ = SVar26.values.values._8_8_;
  auVar22._8_56_ = auVar24;
  auVar10._0_8_ = SVar26.values.values._0_8_;
  auVar10._8_56_ = auVar13;
  vmovlpd_avx(auVar10._0_16_);
  vmovlpd_avx(auVar22._0_16_);
  auVar13 = ZEXT856(0);
  auVar24 = ZEXT856(0);
  a_01.values.values[2] = (float)in_stack_fffffffffffffee0;
  a_01.values.values._0_8_ = in_stack_fffffffffffffed8;
  a_01.values.values[3] = in_stack_fffffffffffffee4;
  b_00.values.values[1] = X_00;
  b_00.values.values[0] = Y_00;
  b_00.values.values[2] = (float)(int)in_stack_fffffffffffffed0;
  b_00.values.values[3] = (float)(int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  SVar26 = SafeDiv(a_01,b_00);
  auVar23._0_8_ = SVar26.values.values._8_8_;
  auVar23._8_56_ = auVar24;
  auVar11._0_8_ = SVar26.values.values._0_8_;
  auVar11._8_56_ = auVar13;
  vmovlpd_avx(auVar11._0_16_);
  vmovlpd_avx(auVar23._0_16_);
  Z_00 = Average((SampledSpectrum *)in_RDI);
  this_00 = &local_6c;
  XYZ::XYZ(this_00,X_00,Y_00,Z_00);
  auVar13 = (undefined1  [56])0x0;
  XVar25 = XYZ::operator/(this_00,X_00);
  auVar12._0_8_ = XVar25._0_8_;
  auVar12._8_56_ = auVar13;
  uVar1 = vmovlpd_avx(auVar12._0_16_);
  XVar25.Z = XVar25.Z;
  XVar25.X = (Float)(int)uVar1;
  XVar25.Y = (Float)(int)((ulong)uVar1 >> 0x20);
  return XVar25;
}

Assistant:

PBRT_CPU_GPU XYZ SampledSpectrum::ToXYZ(const SampledWavelengths &lambda) const {
    // Sample the $X$, $Y$, and $Z$ matching curves at _lambda_
    SampledSpectrum X = Spectra::X().Sample(lambda);
    SampledSpectrum Y = Spectra::Y().Sample(lambda);
    SampledSpectrum Z = Spectra::Z().Sample(lambda);

    // Evaluate estimator to compute $(x,y,z)$ coefficients
    SampledSpectrum pdf = lambda.PDF();
    return XYZ(SafeDiv(X * *this, pdf).Average(), SafeDiv(Y * *this, pdf).Average(),
               SafeDiv(Z * *this, pdf).Average()) /
           CIE_Y_integral;
}